

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O2

void Aig_ObjPrint(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  int *piVar6;
  
  if (pObj == (Aig_Obj_t *)0x0) {
    pcVar4 = "Object is NULL.";
    goto LAB_0057b1d5;
  }
  if (((ulong)pObj & 1) != 0) {
    printf("Compl ");
    pObj = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x14a,"void Aig_ObjPrint(Aig_Man_t *, Aig_Obj_t *)");
  }
  printf("Node %4d : ",(ulong)(uint)pObj->Id);
  iVar2 = Aig_ObjIsConst1(pObj);
  if (iVar2 == 0) {
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
    if (uVar3 == 4) {
      uVar3 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
      pcVar4 = "\'";
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        pcVar4 = " ";
      }
      pcVar5 = "BUF( %d%s )";
    }
    else {
      if (uVar3 != 3) {
        if (uVar3 == 2) {
          pcVar4 = "PI";
          goto LAB_0057b02e;
        }
        pcVar5 = "\'";
        pcVar4 = "\'";
        if (((ulong)pObj->pFanin0 & 1) == 0) {
          pcVar4 = " ";
        }
        if (((ulong)pObj->pFanin1 & 1) == 0) {
          pcVar5 = " ";
        }
        printf("AND( %4d%s, %4d%s )",
               (ulong)*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24),pcVar4,
               (ulong)*(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24),pcVar5);
        goto LAB_0057b10c;
      }
      uVar3 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
      pcVar4 = "\'";
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        pcVar4 = " ";
      }
      pcVar5 = "PO( %4d%s )";
    }
    printf(pcVar5,(ulong)uVar3,pcVar4);
  }
  else {
    pcVar4 = "constant 1";
LAB_0057b02e:
    printf(pcVar4);
  }
LAB_0057b10c:
  piVar6 = &pObj->Id;
  printf(" (refs = %3d)",(ulong)(*(uint *)&pObj->field_0x18 >> 6));
  if ((p->pEquivs == (Aig_Obj_t **)0x0) || (p->pEquivs[*piVar6] == (Aig_Obj_t *)0x0)) {
    if ((p->pReprs != (Aig_Obj_t **)0x0) && (p->pReprs[*piVar6] != (Aig_Obj_t *)0x0)) {
      printf("  class of %d");
      return;
    }
    return;
  }
  printf("  { %4d ");
  while( true ) {
    pAVar1 = p->pEquivs[*piVar6];
    if (pAVar1 == (Aig_Obj_t *)0x0) break;
    pcVar4 = " ";
    if (((*(uint *)&pObj->field_0x18 ^ *(uint *)&pAVar1->field_0x18) & 8) != 0) {
      pcVar4 = "\'";
    }
    piVar6 = &pAVar1->Id;
    printf(" %4d%s",(ulong)(uint)pAVar1->Id,pcVar4);
  }
  pcVar4 = " }";
LAB_0057b1d5:
  printf(pcVar4);
  return;
}

Assistant:

void Aig_ObjPrint( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    int fShowFanouts = 0;
    Aig_Obj_t * pTemp;
    if ( pObj == NULL )
    {
        printf( "Object is NULL." );
        return;
    }
    if ( Aig_IsComplement(pObj) )
    {
        printf( "Compl " );
        pObj = Aig_Not(pObj);
    }
    assert( !Aig_IsComplement(pObj) );
    printf( "Node %4d : ", Aig_ObjId(pObj) );
    if ( Aig_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Aig_ObjIsCi(pObj) )
        printf( "PI" );
    else if ( Aig_ObjIsCo(pObj) )
        printf( "PO( %4d%s )", Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Aig_ObjIsBuf(pObj) )
        printf( "BUF( %d%s )", Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %4d%s, %4d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " "), 
            Aig_ObjFanin1(pObj)->Id, (Aig_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Aig_ObjRefs(pObj) );
    if ( fShowFanouts && p->pFanData )
    {
        Aig_Obj_t * pFanout;
        int i;
        int iFan = -1; // Suppress "might be used uninitialized"
        printf( "\nFanouts:\n" );
        Aig_ObjForEachFanout( p, pObj, pFanout, iFan, i )
        {
            printf( "    " );
            printf( "Node %4d : ", Aig_ObjId(pFanout) );
            if ( Aig_ObjIsCo(pFanout) )
                printf( "PO( %4d%s )", Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " ") );
            else if ( Aig_ObjIsBuf(pFanout) )
                printf( "BUF( %d%s )", Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " ") );
            else
                printf( "AND( %4d%s, %4d%s )", 
                    Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " "), 
                    Aig_ObjFanin1(pFanout)->Id, (Aig_ObjFaninC1(pFanout)? "\'" : " ") );
            printf( "\n" );
        }
        return;
    }
    // there are choices
    if ( p->pEquivs && p->pEquivs[pObj->Id] )
    {
        // print equivalence class
        printf( "  { %4d ", pObj->Id );
        for ( pTemp = p->pEquivs[pObj->Id]; pTemp; pTemp = p->pEquivs[pTemp->Id] )
            printf( " %4d%s", pTemp->Id, (pTemp->fPhase != pObj->fPhase)? "\'" : " " );
        printf( " }" );
        return;
    }
    // this is a secondary node
    if ( p->pReprs && p->pReprs[pObj->Id] )
        printf( "  class of %d", pObj->Id );
}